

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_fout(t_radio *x,t_floatarg f)

{
  t_float local_40;
  undefined1 local_38 [4];
  t_float outval;
  t_atom at [2];
  int i;
  t_floatarg f_local;
  t_radio *x_local;
  
  at[1].a_w._0_4_ = (undefined4)f;
  x->x_fval = f;
  if ((int)at[1].a_w._0_4_ < 0) {
    at[1].a_w.w_float = 0.0;
  }
  if (x->x_number <= (int)at[1].a_w._0_4_) {
    at[1].a_w._0_4_ = x->x_number + -1;
  }
  at[1].a_w._4_4_ = f;
  if (x->x_compat == 0) {
    if (pd_compatibilitylevel < 0x2e) {
      local_40 = (t_float)(int)at[1].a_w._0_4_;
    }
    else {
      local_40 = x->x_fval;
    }
    x->x_on_old = x->x_on;
    x->x_on = at[1].a_w.w_float;
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
    outlet_float((x->x_gui).x_obj.te_outlet,local_40);
    if ((((uint)(x->x_gui).x_fsf >> 7 & 1) != 0) && (((x->x_gui).x_snd)->s_thing != (_class **)0x0))
    {
      pd_float(((x->x_gui).x_snd)->s_thing,local_40);
    }
  }
  else {
    if ((x->x_change != 0) && (at[1].a_w.w_index != x->x_on_old)) {
      local_38 = (undefined1  [4])0x1;
      at[0].a_type = (t_atomtype)(float)x->x_on_old;
      at[0].a_w.w_float = 1.4013e-45;
      at[1].a_type = A_NULL;
      outlet_list((x->x_gui).x_obj.te_outlet,&s_list,2,(t_atom *)local_38);
      if ((((uint)(x->x_gui).x_fsf >> 7 & 1) != 0) &&
         (((x->x_gui).x_snd)->s_thing != (_class **)0x0)) {
        pd_list(((x->x_gui).x_snd)->s_thing,&s_list,2,(t_atom *)local_38);
      }
    }
    if (x->x_on != x->x_on_old) {
      x->x_on_old = x->x_on;
    }
    x->x_on = at[1].a_w.w_float;
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
    x->x_on_old = x->x_on;
    local_38 = (undefined1  [4])0x1;
    at[0].a_type = (t_atomtype)(float)x->x_on;
    at[0].a_w.w_float = 1.4013e-45;
    at[1].a_type = 0x3f800000;
    outlet_list((x->x_gui).x_obj.te_outlet,&s_list,2,(t_atom *)local_38);
    if ((((uint)(x->x_gui).x_fsf >> 7 & 1) != 0) && (((x->x_gui).x_snd)->s_thing != (_class **)0x0))
    {
      pd_list(((x->x_gui).x_snd)->s_thing,&s_list,2,(t_atom *)local_38);
    }
  }
  return;
}

Assistant:

static void radio_fout(t_radio *x, t_floatarg f)
{
    int i = (int)f;

    x->x_fval = f;
    if(i < 0)
        i = 0;
    if(i >= x->x_number)
        i = x->x_number - 1;

    if(x->x_compat)
    {
            /* compatibility with earlier "[hv]dial" behavior */
        t_atom at[2];
        if((x->x_change) && (i != x->x_on_old))
        {
            SETFLOAT(at+0, (t_float)x->x_on_old);
            SETFLOAT(at+1, 0.0);
            outlet_list(x->x_gui.x_obj.ob_outlet, &s_list, 2, at);
            if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
                pd_list(x->x_gui.x_snd->s_thing, &s_list, 2, at);
        }
        if(x->x_on != x->x_on_old)
            x->x_on_old = x->x_on;
        x->x_on = i;
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
        x->x_on_old = x->x_on;
        SETFLOAT(at+0, (t_float)x->x_on);
        SETFLOAT(at+1, 1.0);
        outlet_list(x->x_gui.x_obj.ob_outlet, &s_list, 2, at);
        if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
            pd_list(x->x_gui.x_snd->s_thing, &s_list, 2, at);
    }
    else
    {
        t_float outval = (pd_compatibilitylevel < 46 ? i : x->x_fval);
        x->x_on_old = x->x_on;
        x->x_on = i;
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
        outlet_float(x->x_gui.x_obj.ob_outlet, outval);
        if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
            pd_float(x->x_gui.x_snd->s_thing, outval);
    }
}